

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O2

bool __thiscall Bstrlib::CBString::operator==(CBString *this,uchar *s)

{
  int iVar1;
  CBStringException *pCVar2;
  allocator local_79;
  CBStringException bstr__cppwrapper_exception;
  string local_50;
  string local_30;
  
  if (s == (uchar *)0x0) {
    std::__cxx11::string::string
              ((string *)&local_30,"CBString::Failure in compare (== NULL)",&local_79);
    CBStringException::CBStringException(&bstr__cppwrapper_exception,&local_30);
    std::__cxx11::string::~string((string *)&local_30);
    pCVar2 = (CBStringException *)__cxa_allocate_exception(0x28);
    CBStringException::CBStringException(pCVar2,&bstr__cppwrapper_exception);
    __cxa_throw(pCVar2,&CBStringException::typeinfo,CBStringException::~CBStringException);
  }
  iVar1 = biseqcstr(&this->super_tagbstring,(char *)s);
  if (iVar1 != -1) {
    return 0 < iVar1;
  }
  std::__cxx11::string::string((string *)&local_50,"CBString::Failure in compare (==)",&local_79);
  CBStringException::CBStringException(&bstr__cppwrapper_exception,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  pCVar2 = (CBStringException *)__cxa_allocate_exception(0x28);
  CBStringException::CBStringException(pCVar2,&bstr__cppwrapper_exception);
  __cxa_throw(pCVar2,&CBStringException::typeinfo,CBStringException::~CBStringException);
}

Assistant:

bool CBString::operator == (const unsigned char * s) const {
	int retval;
	if (NULL == s) {
		bstringThrow ("Failure in compare (== NULL)");
	}
	if (BSTR_ERR == (retval = biseqcstr ((bstring) this, (const char *) s))) {
		bstringThrow ("Failure in compare (==)");
	}
	return retval > 0;
}